

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

ssize_t __thiscall
libchars::terminal_driver::read(terminal_driver *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  undefined1 local_50 [8];
  timeval T_start;
  timeval T_now;
  
  uVar3 = this->rbuf_deq;
  if (this->rbuf_enq <= uVar3) {
    gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
    uVar3 = this->rbuf_deq;
    if (this->rbuf_enq <= uVar3) {
      do {
        uVar1 = read_characters(this,false);
        if ((int)uVar1 < 0) {
          return (ulong)uVar1;
        }
        if (uVar1 == 0) {
          if (__buf == (void *)0x0) {
            return 0;
          }
          iVar2 = gettimeofday((timeval *)&T_start.tv_usec,(__timezone_ptr_t)0x0);
          if (iVar2 != 0) {
            return 0;
          }
          if (((long)local_50 + (long)__buf) * 1000 + (ulong)T_start.tv_sec / 1000 <=
              (ulong)T_now.tv_sec / 1000 + T_start.tv_usec * 1000) {
            return 0xfffffffd;
          }
        }
        uVar3 = this->rbuf_deq;
      } while (this->rbuf_enq <= uVar3);
    }
  }
  *(uint8_t *)CONCAT44(in_register_00000034,__fd) = this->rbuf[this->rbuf_size - 1 & uVar3];
  this->rbuf_deq = this->rbuf_deq + 1;
  return 1;
}

Assistant:

int terminal_driver::read(uint8_t &c, size_t timeout_s)
    {
        if (rbuf_enq <= rbuf_deq) {
            struct timeval T_start;
            gettimeofday(&T_start, NULL);
            uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
            uint64_t timeout_ms = timeout_s * 1000UL;

            while (rbuf_enq <= rbuf_deq) {
                int r = read_characters(false);
                if (r < 0)
                    return r;
                else if (r == 0) {
                    if (timeout_s > 0) {
                        struct timeval T_now;
                        if (gettimeofday(&T_now, NULL) == 0) {
                            uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                            if (t_msec_now >= (t_msec_start + timeout_ms))
                                return -3;
                        }
                        else {
                            return r;
                        }
                    }
                    else {
                        return r;
                    }
                }
            }
        }

        size_t rbuf_mask = (rbuf_size - 1);
        c = *(rbuf + (rbuf_deq & rbuf_mask));
        ++rbuf_deq;

        return 1;
    }